

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
Eigen::Matrix<double,-1,-1,0,-1,-1>::
Matrix<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>>>
          (Matrix<double,_1,_1,0,_1,_1> *this,
          ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
          *other)

{
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
             *(Index *)(other + 8),*(Index *)(other + 0x10));
  internal::
  compute_inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)other,(Matrix<double,__1,__1,_0,__1,__1> *)this);
  return;
}

Assistant:

EIGEN_STRONG_INLINE Matrix(const ReturnByValue<OtherDerived>& other)
    {
      Base::_check_template_params();
      Base::resize(other.rows(), other.cols());
      other.evalTo(*this);
    }